

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

int Frc_ObjFanoutsAreCos(Frc_Obj_t *pThis)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Frc_Obj_t *pFStack_20;
  int i;
  Frc_Obj_t *pNext;
  Frc_Obj_t *pThis_local;
  
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < (int)pThis->nFanouts) {
      pFStack_20 = Frc_ObjFanout(pThis,local_24);
      bVar2 = pFStack_20 != (Frc_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Frc_ObjIsCo(pFStack_20);
    if (iVar1 == 0) {
      return 0;
    }
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int Frc_ObjFanoutsAreCos( Frc_Obj_t * pThis )
{
    Frc_Obj_t * pNext;
    int i;
    Frc_ObjForEachFanout( pThis, pNext, i )
        if ( !Frc_ObjIsCo(pNext) )
            return 0;
    return 1;
}